

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_sse41_128_16.c
# Opt level: O2

void arr_store_si128(int *array,__m128i vH,int32_t t,int32_t seglen,int32_t d,int32_t dlen)

{
  ulong uVar1;
  long lVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  
  uVar1 = (ulong)(uint)seglen;
  lVar2 = (long)t;
  array[uVar1 * (long)(int)vH[0] + lVar2] = (int)(char)in_XMM0_Qa;
  array[(long)((int)vH[1] + (int)vH[0]) * uVar1 + lVar2] = (int)(char)((ulong)in_XMM0_Qa >> 8);
  array[(long)((int)vH[0] + (int)vH[1] * 2) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qa >> 0x10);
  array[(long)((int)vH[1] * 3 + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qa >> 0x18);
  array[(long)((int)vH[0] + (int)vH[1] * 4) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qa >> 0x20);
  array[(long)((int)vH[1] * 5 + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qa >> 0x28);
  array[(long)((int)vH[1] * 6 + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qa >> 0x30);
  array[(long)((int)vH[1] * 7 + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qa >> 0x38);
  array[(long)((int)vH[0] + (int)vH[1] * 8) * uVar1 + lVar2] = (int)(char)in_XMM0_Qb;
  array[(long)((int)vH[1] * 9 + (int)vH[0]) * uVar1 + lVar2] = (int)(char)((ulong)in_XMM0_Qb >> 8);
  array[(long)((int)vH[1] * 10 + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qb >> 0x10);
  array[(long)((int)vH[1] * 0xb + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qb >> 0x18);
  array[(long)((int)vH[1] * 0xc + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qb >> 0x20);
  array[(long)((int)vH[1] * 0xd + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qb >> 0x28);
  array[(long)((int)vH[1] * 0xe + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qb >> 0x30);
  array[(long)((int)vH[1] * 0xf + (int)vH[0]) * uVar1 + lVar2] =
       (int)(char)((ulong)in_XMM0_Qb >> 0x38);
  return;
}

Assistant:

static inline void arr_store_si128(
        int *array,
        __m128i vH,
        int32_t t,
        int32_t seglen,
        int32_t d,
        int32_t dlen)
{
    array[1LL*(0*seglen+t)*dlen + d] = (int16_t)_mm_extract_epi16(vH, 0);
    array[1LL*(1*seglen+t)*dlen + d] = (int16_t)_mm_extract_epi16(vH, 1);
    array[1LL*(2*seglen+t)*dlen + d] = (int16_t)_mm_extract_epi16(vH, 2);
    array[1LL*(3*seglen+t)*dlen + d] = (int16_t)_mm_extract_epi16(vH, 3);
    array[1LL*(4*seglen+t)*dlen + d] = (int16_t)_mm_extract_epi16(vH, 4);
    array[1LL*(5*seglen+t)*dlen + d] = (int16_t)_mm_extract_epi16(vH, 5);
    array[1LL*(6*seglen+t)*dlen + d] = (int16_t)_mm_extract_epi16(vH, 6);
    array[1LL*(7*seglen+t)*dlen + d] = (int16_t)_mm_extract_epi16(vH, 7);
}